

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O0

bool __thiscall
UnifiedRegex::JumpIfNotCharInst::Exec
          (JumpIfNotCharInst *this,Matcher *matcher,Char *input,CharCount inputLength,
          CharCount *matchStart,CharCount *inputOffset,CharCount *nextSyncInputOffset,
          uint8 **instPointer,ContStack *contStack,AssertionStack *assertionStack,uint *qcTicks,
          bool firstIteration)

{
  uint8 *puVar1;
  bool firstIteration_local;
  CharCount *inputOffset_local;
  CharCount *matchStart_local;
  CharCount inputLength_local;
  Char *input_local;
  Matcher *matcher_local;
  JumpIfNotCharInst *this_local;
  
  Matcher::CompStats(matcher);
  if ((*inputOffset < inputLength) && (input[*inputOffset] == (this->super_CharMixin).c)) {
    *instPointer = *instPointer + 7;
  }
  else {
    puVar1 = Matcher::LabelToInstPointer(matcher,(this->super_JumpMixin).targetLabel);
    *instPointer = puVar1;
  }
  return false;
}

Assistant:

inline bool JumpIfNotCharInst::Exec(REGEX_INST_EXEC_PARAMETERS) const
    {
#if ENABLE_REGEX_CONFIG_OPTIONS
        matcher.CompStats();
#endif
        if (inputOffset < inputLength && input[inputOffset] == c)
        {
            instPointer += sizeof(*this);
        }
        else
        {
            instPointer = matcher.LabelToInstPointer(targetLabel);
        }
        return false;
    }